

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resize_avx2.c
# Opt level: O0

void av1_resize_horz_dir_avx2
               (uint8_t *input,int in_stride,uint8_t *intbuf,int height,int filtered_length,
               int width2)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined8 uVar46;
  uint8_t auVar47 [32];
  undefined8 uVar48;
  undefined8 uVar49;
  undefined8 coeffs;
  undefined8 uVar50;
  undefined8 uVar51;
  undefined8 uVar52;
  undefined8 uVar53;
  undefined8 uVar54;
  undefined8 uVar55;
  undefined8 uVar56;
  undefined8 uVar57;
  int iVar58;
  int iVar59;
  int iVar60;
  int in_ECX;
  long in_RDX;
  longlong extraout_RDX;
  longlong extraout_RDX_00;
  int in_ESI;
  longlong *plVar61;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  bool bVar62;
  undefined1 auVar63 [32];
  __m128i v;
  __m128i v_00;
  int out_idx_2;
  int in_idx_2;
  __m256i res_out_row01_3;
  __m256i res_out;
  __m256i res_out_0_3 [2];
  __m256i r0_3;
  __m128i row1_3;
  __m128i row0_3;
  int is_last_cols_8;
  int out_idx_1;
  int in_idx_1;
  __m128i low_result;
  __m256i res_out_row01_2;
  __m256i res_out_0_2 [2];
  __m256i r1_2;
  int is_last_cols16;
  __m256i r0_2;
  __m128i row1_2;
  __m128i row0_2;
  int out_idx;
  int in_idx;
  int wd_processed;
  __m128i high_128_1;
  __m128i low_128_1;
  __m256i res_out_row01_1;
  __m256i res_out_r01_1;
  __m256i res_out_r1_1;
  __m256i res_out_r0_1;
  __m256i res_out_1_1 [2];
  __m256i res_out_0_1 [2];
  __m256i r2_1;
  __m128i row1_0_1;
  __m128i row0_0_1;
  int is_last_cols32_1;
  __m256i r1_1;
  __m256i r0_1;
  __m256i row1_1;
  __m256i row0_1;
  int j_1;
  int row_offset_1;
  int remain_col;
  int filter_offset_1;
  int i_1;
  __m128i high_128;
  __m128i low_128;
  __m256i res_out_row01;
  __m256i res_out_r01;
  __m256i res_out_r1;
  __m256i res_out_r0;
  __m256i res_out_1 [2];
  __m256i res_out_0 [2];
  __m256i r2;
  __m128i row1_0;
  __m128i row0_0;
  int is_last_cols32;
  __m256i r1;
  __m256i r0;
  __m256i row1;
  __m256i row0;
  int j;
  int row_offset;
  int filter_offset;
  int i;
  __m256i wd8_end_pad_mask;
  __m256i wd32_end_pad_mask;
  __m256i wd32_start_pad_mask;
  __m256i zero;
  __m256i clip_pixel;
  uint8_t max_pixel;
  __m256i round_const_bits;
  __m128i round_shift_bits;
  int dst_stride;
  int bits;
  __m256i coeffs_x [4];
  __m256i s1 [4];
  __m256i s0 [4];
  int filt_length;
  undefined8 local_1940;
  undefined8 uStackY_1938;
  undefined8 uStackY_1930;
  undefined8 uStackY_1928;
  undefined8 local_1920;
  undefined8 uStackY_1918;
  undefined8 uVar64;
  uint8_t *output;
  int in_stack_ffffffffffffe704;
  __m256i *in_stack_ffffffffffffe708;
  undefined1 local_18c0 [32];
  undefined1 local_1870 [16];
  undefined8 local_1860;
  undefined8 uStack_1858;
  undefined8 uStack_1850;
  undefined8 uStack_1848;
  __m256i *res_out_00;
  undefined1 local_1840 [32];
  undefined8 uStack_1828;
  undefined8 local_1820;
  undefined8 uStack_1818;
  undefined8 uStack_1810;
  undefined8 uStack_1808;
  undefined1 local_1800 [32];
  undefined1 local_17c0 [32];
  undefined8 local_1760;
  undefined8 uStack_1758;
  undefined8 local_1740;
  undefined8 uStack_1738;
  undefined1 auStack_1730 [16];
  undefined8 local_1720;
  undefined8 uStack_1718;
  undefined8 uStack_1710;
  undefined8 uStack_1708;
  undefined8 local_1700;
  undefined8 uStack_16f8;
  undefined8 uStack_16f0;
  undefined8 uStack_16e8;
  undefined8 local_16e0;
  undefined8 uStack_16d8;
  undefined8 uStack_16d0;
  undefined8 uStack_16c8;
  undefined1 local_16c0 [32];
  undefined8 local_16a0;
  __m256i *palVar65;
  undefined8 uVar66;
  uint8_t *intbuf_00;
  undefined8 uStack_1670;
  undefined1 local_1680 [32];
  undefined8 uStack_1668;
  undefined8 local_1660;
  undefined8 uStack_1658;
  undefined8 uStack_1650;
  undefined8 uStack_1648;
  undefined1 local_1640 [32];
  undefined1 local_15e0 [32];
  undefined1 local_15c0 [32];
  int local_1554;
  int local_1550;
  int local_154c;
  int local_1548;
  int local_1544;
  undefined8 local_1540;
  undefined8 uStack_1538;
  undefined8 local_1520;
  undefined8 uStack_1518;
  undefined1 auStack_1510 [16];
  undefined8 local_1500;
  undefined8 uStack_14f8;
  undefined8 uStack_14f0;
  undefined8 uStack_14e8;
  undefined8 local_14e0;
  undefined8 uStack_14d8;
  undefined8 uStack_14d0;
  undefined8 uStack_14c8;
  undefined8 local_14c0;
  undefined8 uStack_14b8;
  undefined8 uStack_14b0;
  undefined8 uStack_14a8;
  undefined1 local_14a0 [32];
  undefined1 local_1480 [32];
  undefined1 local_1460 [32];
  undefined1 local_1440 [32];
  undefined1 local_1420 [32];
  undefined1 local_13c0 [32];
  undefined1 local_13a0 [32];
  int local_1330;
  int local_132c;
  int local_1328;
  int local_1324;
  undefined8 local_1320;
  undefined8 uStack_1318;
  undefined8 uStack_1310;
  undefined8 uStack_1308;
  longlong local_1220 [16];
  undefined8 local_11a0;
  undefined8 uStack_1198;
  undefined8 uStack_1190;
  undefined8 uStack_1188;
  undefined1 local_1180 [32];
  undefined1 local_1160 [32];
  undefined1 local_1140 [32];
  undefined8 local_1120;
  undefined8 uStack_1118;
  undefined8 uStack_1110;
  undefined8 uStack_1108;
  undefined1 local_1100 [32];
  undefined1 local_10e0 [32];
  undefined1 local_10c0 [32];
  undefined4 local_1088;
  int local_1080;
  int local_107c;
  long local_1078;
  int local_106c;
  long local_1068;
  undefined1 local_1060 [16];
  undefined4 local_104c;
  undefined4 local_1048;
  undefined1 local_1041;
  undefined1 local_1040 [32];
  undefined1 (*local_1020) [16];
  undefined1 (*local_1018) [16];
  undefined1 (*local_1010) [16];
  undefined1 (*local_1008) [16];
  undefined8 local_1000;
  undefined8 uStack_ff8;
  undefined8 local_ff0;
  undefined8 uStack_fe8;
  ulong local_fe0;
  undefined8 uStack_fd8;
  ulong local_fd0;
  undefined8 uStack_fc8;
  undefined8 local_fc0;
  undefined8 uStack_fb8;
  undefined8 local_fb0;
  undefined8 uStack_fa8;
  ulong local_fa0;
  undefined8 uStack_f98;
  ulong local_f90;
  undefined8 uStack_f88;
  ulong local_f80;
  undefined8 uStack_f78;
  ulong local_f70;
  undefined8 uStack_f68;
  undefined8 local_f60;
  undefined8 uStack_f58;
  undefined8 uStack_f50;
  undefined8 uStack_f48;
  undefined8 local_f40;
  undefined8 uStack_f38;
  undefined8 uStack_f30;
  undefined8 uStack_f28;
  undefined8 local_f20;
  undefined8 uStack_f18;
  undefined8 uStack_f10;
  undefined8 uStack_f08;
  undefined8 local_f00;
  __m256i *palStack_ef8;
  undefined8 uStack_ef0;
  undefined8 uStack_ee8;
  undefined8 local_ee0;
  undefined8 uStack_ed8;
  undefined8 uStack_ed0;
  undefined8 uStack_ec8;
  undefined8 local_ec0;
  __m256i *palStack_eb8;
  undefined8 uStack_eb0;
  undefined8 uStack_ea8;
  undefined8 local_ea0;
  undefined8 uStack_e98;
  undefined8 uStack_e90;
  undefined8 uStack_e88;
  undefined8 local_e80;
  __m256i *palStack_e78;
  undefined8 uStack_e70;
  undefined8 uStack_e68;
  undefined8 local_e60;
  undefined8 uStack_e58;
  undefined8 uStack_e50;
  undefined8 uStack_e48;
  undefined8 local_e40;
  __m256i *palStack_e38;
  undefined8 uStack_e30;
  undefined8 uStack_e28;
  undefined8 local_e20;
  undefined8 uStack_e18;
  undefined8 uStack_e10;
  undefined8 uStack_e08;
  undefined8 local_e00;
  __m256i *palStack_df8;
  undefined8 uStack_df0;
  undefined8 uStack_de8;
  undefined8 local_de0;
  undefined8 uStack_dd8;
  undefined8 uStack_dd0;
  undefined8 uStack_dc8;
  undefined8 local_dc0;
  __m256i *palStack_db8;
  undefined8 uStack_db0;
  undefined8 uStack_da8;
  undefined8 local_da0;
  undefined8 uStack_d98;
  undefined8 uStack_d90;
  undefined8 uStack_d88;
  undefined8 local_d80;
  __m256i *palStack_d78;
  undefined8 uStack_d70;
  undefined8 uStack_d68;
  undefined8 local_d60;
  undefined8 uStack_d58;
  undefined8 uStack_d50;
  undefined8 uStack_d48;
  undefined8 local_d40;
  __m256i *palStack_d38;
  undefined8 uStack_d30;
  undefined8 uStack_d28;
  undefined8 local_d20;
  undefined8 uStack_d18;
  undefined8 uStack_d10;
  undefined8 uStack_d08;
  undefined8 local_d00;
  __m256i *palStack_cf8;
  undefined8 uStack_cf0;
  undefined8 uStack_ce8;
  undefined8 local_ce0;
  undefined8 uStack_cd8;
  undefined8 uStack_cd0;
  undefined8 uStack_cc8;
  undefined8 local_cc0;
  __m256i *palStack_cb8;
  undefined8 uStack_cb0;
  undefined8 uStack_ca8;
  ulong local_c90;
  undefined8 uStack_c88;
  undefined1 local_c80 [32];
  ulong local_c50;
  undefined8 uStack_c48;
  undefined1 local_c40 [32];
  ulong local_c10;
  undefined8 uStack_c08;
  undefined1 local_c00 [32];
  ulong local_bd0;
  undefined8 uStack_bc8;
  undefined1 local_bc0 [32];
  ulong local_b90;
  undefined8 uStack_b88;
  undefined1 local_b80 [32];
  ulong local_b50;
  undefined8 uStack_b48;
  undefined1 local_b40 [32];
  ulong local_b10;
  undefined8 uStack_b08;
  undefined1 local_b00 [32];
  ulong local_ad0;
  undefined8 uStack_ac8;
  undefined1 local_ac0 [32];
  ulong local_a90;
  undefined8 uStack_a88;
  undefined1 local_a80 [32];
  ulong local_a50;
  undefined8 uStack_a48;
  undefined1 local_a40 [32];
  ulong local_a10;
  undefined8 uStack_a08;
  undefined1 local_a00 [32];
  undefined8 local_9e0;
  undefined8 uStack_9d8;
  undefined8 uStack_9d0;
  undefined8 uStack_9c8;
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  undefined8 uStack_9b0;
  undefined8 uStack_9a8;
  undefined8 local_9a0;
  undefined8 uStack_998;
  undefined8 uStack_990;
  undefined8 uStack_988;
  undefined8 local_980;
  undefined8 uStack_978;
  undefined8 uStack_970;
  undefined8 uStack_968;
  undefined8 local_960;
  undefined8 uStack_958;
  undefined8 uStack_950;
  undefined8 uStack_948;
  undefined8 local_940;
  undefined8 uStack_938;
  undefined8 uStack_930;
  undefined8 uStack_928;
  undefined8 local_920;
  undefined8 uStack_918;
  undefined8 uStack_910;
  undefined8 uStack_908;
  undefined8 local_900;
  undefined8 uStack_8f8;
  undefined8 uStack_8f0;
  undefined8 uStack_8e8;
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  undefined8 uStack_8d0;
  undefined8 uStack_8c8;
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined8 uStack_8b0;
  undefined8 uStack_8a8;
  undefined8 local_8a0;
  undefined8 uStack_898;
  undefined8 uStack_890;
  undefined8 uStack_888;
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 uStack_870;
  undefined8 uStack_868;
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 uStack_850;
  undefined8 uStack_848;
  undefined8 local_840;
  undefined8 uStack_838;
  undefined8 uStack_830;
  undefined8 uStack_828;
  undefined8 local_820;
  undefined8 uStack_818;
  undefined8 uStack_810;
  undefined8 uStack_808;
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 uStack_7f0;
  undefined8 uStack_7e8;
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  undefined8 uStack_7d0;
  undefined8 uStack_7c8;
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined8 uStack_7b0;
  undefined8 uStack_7a8;
  undefined8 local_7a0;
  undefined8 uStack_798;
  undefined8 uStack_790;
  undefined8 uStack_788;
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 uStack_770;
  undefined8 uStack_768;
  undefined8 local_760;
  undefined8 uStack_758;
  undefined8 uStack_750;
  undefined8 uStack_748;
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 uStack_730;
  undefined8 uStack_728;
  undefined8 local_720;
  undefined8 uStack_718;
  undefined8 uStack_710;
  undefined8 uStack_708;
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 uStack_6f0;
  undefined8 uStack_6e8;
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined8 uStack_6d0;
  undefined8 uStack_6c8;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 uStack_6b0;
  undefined8 uStack_6a8;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 uStack_690;
  undefined8 uStack_688;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 uStack_670;
  undefined8 uStack_668;
  undefined8 local_660;
  __m256i *palStack_658;
  undefined8 uStack_650;
  undefined8 uStack_648;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  undefined8 local_620;
  __m256i *palStack_618;
  undefined8 uStack_610;
  undefined8 uStack_608;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  undefined8 local_5e0;
  __m256i *palStack_5d8;
  undefined8 uStack_5d0;
  undefined8 uStack_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  undefined8 local_5a0;
  __m256i *palStack_598;
  undefined8 uStack_590;
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 uStack_570;
  undefined8 uStack_568;
  undefined1 local_560 [16];
  undefined1 (*local_548) [16];
  undefined1 local_540 [16];
  undefined8 *local_528;
  undefined1 local_520 [16];
  undefined1 (*local_508) [16];
  undefined1 local_500 [16];
  undefined8 *local_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined1 local_4c0 [32];
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  ulong local_450;
  undefined8 uStack_448;
  ulong *local_438;
  ulong local_430;
  undefined8 uStack_428;
  ulong *local_418;
  ulong local_410;
  undefined8 uStack_408;
  ulong *local_3f8;
  ulong local_3f0;
  undefined8 uStack_3e8;
  ulong *local_3d8;
  ulong local_3d0;
  undefined8 uStack_3c8;
  ulong *local_3b8;
  ulong local_3b0;
  undefined8 uStack_3a8;
  ulong *local_398;
  undefined1 local_390 [16];
  undefined8 *local_378;
  undefined8 local_370;
  undefined8 uStack_368;
  undefined8 *local_360;
  undefined1 (*local_358) [32];
  undefined1 (*local_350) [32];
  undefined1 (*local_348) [32];
  undefined1 (*local_340) [32];
  uint8_t *local_338;
  uint8_t *local_330;
  uint8_t *local_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 uStack_310;
  undefined8 uStack_308;
  undefined1 local_300 [32];
  uint8_t local_2e0 [32];
  undefined1 local_2c0 [32];
  uint8_t local_2a0 [32];
  undefined1 local_280 [16];
  undefined1 auStack_270 [16];
  uint8_t local_260 [32];
  undefined1 local_240 [32];
  uint8_t local_220 [32];
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  uint8_t local_1e0 [32];
  undefined1 local_1c0 [32];
  uint8_t local_1a0 [32];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 local_150;
  undefined8 uStack_148;
  undefined8 local_130;
  undefined8 uStack_128;
  undefined8 local_110;
  undefined8 uStack_108;
  undefined8 local_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [16];
  undefined1 auStack_b0 [16];
  undefined4 local_a0;
  undefined4 local_9c;
  undefined4 local_98;
  undefined4 local_94;
  undefined4 local_90;
  undefined4 local_8c;
  undefined4 local_88;
  undefined4 local_84;
  undefined1 local_80 [16];
  undefined1 auStack_70 [16];
  undefined1 local_50;
  undefined1 local_4f;
  undefined1 local_4e;
  undefined1 local_4d;
  undefined1 local_4c;
  undefined1 local_4b;
  undefined1 local_4a;
  undefined1 local_49;
  undefined1 local_48;
  undefined1 local_47;
  undefined1 local_46;
  undefined1 local_45;
  undefined1 local_44;
  undefined1 local_43;
  undefined1 local_42;
  undefined1 local_41;
  undefined1 local_40;
  undefined1 local_3f;
  undefined1 local_3e;
  undefined1 local_3d;
  undefined1 local_3c;
  undefined1 local_3b;
  undefined1 local_3a;
  undefined1 local_39;
  undefined1 local_38;
  undefined1 local_37;
  undefined1 local_36;
  undefined1 local_35;
  undefined1 local_34;
  undefined1 local_33;
  undefined1 local_32;
  undefined1 local_31;
  __m256i *coeffs_00;
  __m256i *s;
  __m256i *input_00;
  
  auVar47 = wd8_right_padding_mask;
  if (in_R8D < 0x20) {
    av1_resize_horz_dir_sse2
              ((uint8_t *)input_00,local_1680._4_4_,intbuf_00,local_16a0._20_4_,local_16a0._16_4_,
               local_16a0._12_4_);
  }
  else {
    local_1088 = 8;
    local_104c = 7;
    local_1060 = ZEXT416(7);
    uVar49 = local_1060._0_8_;
    local_1048 = 0x40;
    local_84 = 0x40;
    local_88 = 0x40;
    local_8c = 0x40;
    local_90 = 0x40;
    local_94 = 0x40;
    local_98 = 0x40;
    local_9c = 0x40;
    local_a0 = 0x40;
    auVar2 = vpinsrd_avx(ZEXT416(0x40),0x40,1);
    auVar2 = vpinsrd_avx(auVar2,0x40,2);
    auVar3 = vpinsrd_avx(auVar2,0x40,3);
    auVar2 = vpinsrd_avx(ZEXT416(0x40),0x40,1);
    auVar2 = vpinsrd_avx(auVar2,0x40,2);
    auStack_b0 = vpinsrd_avx(auVar2,0x40,3);
    local_c0._0_8_ = auVar3._0_8_;
    uVar50 = local_c0._0_8_;
    local_c0._8_8_ = auVar3._8_8_;
    uVar51 = local_c0._8_8_;
    uVar52 = auStack_b0._0_8_;
    uVar53 = auStack_b0._8_8_;
    local_1041 = 0xff;
    local_31 = 0xff;
    local_32 = 0xff;
    local_33 = 0xff;
    local_34 = 0xff;
    local_35 = 0xff;
    local_36 = 0xff;
    local_37 = 0xff;
    local_38 = 0xff;
    local_39 = 0xff;
    local_3a = 0xff;
    local_3b = 0xff;
    local_3c = 0xff;
    local_3d = 0xff;
    local_3e = 0xff;
    local_3f = 0xff;
    local_40 = 0xff;
    local_41 = 0xff;
    local_42 = 0xff;
    local_43 = 0xff;
    local_44 = 0xff;
    local_45 = 0xff;
    local_46 = 0xff;
    local_47 = 0xff;
    local_48 = 0xff;
    local_49 = 0xff;
    local_4a = 0xff;
    local_4b = 0xff;
    local_4c = 0xff;
    local_4d = 0xff;
    local_4e = 0xff;
    local_4f = 0xff;
    local_50 = 0xff;
    auVar2 = vpinsrb_avx(ZEXT116(0xff),0xff,1);
    auVar2 = vpinsrb_avx(auVar2,0xff,2);
    auVar2 = vpinsrb_avx(auVar2,0xff,3);
    auVar2 = vpinsrb_avx(auVar2,0xff,4);
    auVar2 = vpinsrb_avx(auVar2,0xff,5);
    auVar2 = vpinsrb_avx(auVar2,0xff,6);
    auVar2 = vpinsrb_avx(auVar2,0xff,7);
    auVar2 = vpinsrb_avx(auVar2,0xff,8);
    auVar2 = vpinsrb_avx(auVar2,0xff,9);
    auVar2 = vpinsrb_avx(auVar2,0xff,10);
    auVar2 = vpinsrb_avx(auVar2,0xff,0xb);
    auVar2 = vpinsrb_avx(auVar2,0xff,0xc);
    auVar2 = vpinsrb_avx(auVar2,0xff,0xd);
    auVar2 = vpinsrb_avx(auVar2,0xff,0xe);
    auVar2 = vpinsrb_avx(auVar2,0xff,0xf);
    auVar1 = vpinsrb_avx(ZEXT116(0xff),0xff,1);
    auVar1 = vpinsrb_avx(auVar1,0xff,2);
    auVar1 = vpinsrb_avx(auVar1,0xff,3);
    auVar1 = vpinsrb_avx(auVar1,0xff,4);
    auVar1 = vpinsrb_avx(auVar1,0xff,5);
    auVar1 = vpinsrb_avx(auVar1,0xff,6);
    auVar1 = vpinsrb_avx(auVar1,0xff,7);
    auVar1 = vpinsrb_avx(auVar1,0xff,8);
    auVar1 = vpinsrb_avx(auVar1,0xff,9);
    auVar1 = vpinsrb_avx(auVar1,0xff,10);
    auVar1 = vpinsrb_avx(auVar1,0xff,0xb);
    auVar1 = vpinsrb_avx(auVar1,0xff,0xc);
    auVar1 = vpinsrb_avx(auVar1,0xff,0xd);
    auVar1 = vpinsrb_avx(auVar1,0xff,0xe);
    auStack_70 = vpinsrb_avx(auVar1,0xff,0xf);
    local_80._0_8_ = auVar2._0_8_;
    uVar54 = local_80._0_8_;
    local_80._8_8_ = auVar2._8_8_;
    uVar55 = local_80._8_8_;
    uVar56 = auStack_70._0_8_;
    uVar57 = auStack_70._8_8_;
    local_1040._8_8_ = SUB328(ZEXT832(0),4);
    coeffs = local_1040._8_8_;
    uVar46 = 0;
    local_328 = "";
    local_330 = "";
    local_338 = "";
    local_1080 = in_R8D;
    local_107c = in_ECX;
    local_1078 = in_RDX;
    local_106c = in_ESI;
    local_1068 = in_RDI;
    local_1040 = ZEXT832(0) << 0x20;
    local_c0 = auVar3;
    local_80 = auVar2;
    prepare_filter_coeffs(av1_down2_symeven_half_filter,(__m256i *)local_1220);
    if (local_1080 % 0x20 == 0) {
      for (local_1324 = 0; local_1324 < local_107c; local_1324 = local_1324 + 2) {
        local_1328 = 0;
        local_132c = 0;
        for (local_1330 = 0; local_1330 < local_1080; local_1330 = local_1330 + 0x20) {
          local_340 = (undefined1 (*) [32])
                      (local_1068 + ((local_1324 * local_106c + local_1330) - local_1328));
          local_348 = (undefined1 (*) [32])
                      (local_1068 + (((local_1324 + 1) * local_106c + local_1330) - local_1328));
          auVar63 = vperm2i128_avx2(*local_340,*local_348,0x20);
          local_13c0 = vperm2i128_avx2(*local_340,*local_348,0x31);
          local_1328 = 3;
          local_13a0 = auVar63;
          if (local_1330 == 0) {
            local_13a0._0_8_ = auVar63._0_8_;
            local_13a0._8_8_ = auVar63._8_8_;
            local_13a0._16_8_ = auVar63._16_8_;
            local_13a0._24_8_ = auVar63._24_8_;
            local_180 = local_13a0._0_8_;
            uStack_178 = local_13a0._8_8_;
            uStack_170 = local_13a0._16_8_;
            uStack_168 = local_13a0._24_8_;
            local_1a0[0] = '\0';
            local_1a0[1] = '\0';
            local_1a0[2] = '\0';
            local_1a0[3] = '\0';
            local_1a0[4] = '\x01';
            local_1a0[5] = '\x02';
            local_1a0[6] = '\x03';
            local_1a0[7] = '\x04';
            local_1a0[8] = '\x05';
            local_1a0[9] = '\x06';
            local_1a0[10] = '\a';
            local_1a0[0xb] = '\b';
            local_1a0[0xc] = '\t';
            local_1a0[0xd] = '\n';
            local_1a0[0xe] = '\v';
            local_1a0[0xf] = '\f';
            local_1a0[0x10] = '\0';
            local_1a0[0x11] = '\0';
            local_1a0[0x12] = '\0';
            local_1a0[0x13] = '\0';
            local_1a0[0x14] = '\x01';
            local_1a0[0x15] = '\x02';
            local_1a0[0x16] = '\x03';
            local_1a0[0x17] = '\x04';
            local_1a0[0x18] = '\x05';
            local_1a0[0x19] = '\x06';
            local_1a0[0x1a] = '\a';
            local_1a0[0x1b] = '\b';
            local_1a0[0x1c] = '\t';
            local_1a0[0x1d] = '\n';
            local_1a0[0x1e] = '\v';
            local_1a0[0x1f] = '\f';
            auVar41[8] = '\x05';
            auVar41[9] = '\x06';
            auVar41[10] = '\a';
            auVar41[0xb] = '\b';
            auVar41[0xc] = '\t';
            auVar41[0xd] = '\n';
            auVar41[0xe] = '\v';
            auVar41[0xf] = '\f';
            auVar41[0] = '\0';
            auVar41[1] = '\0';
            auVar41[2] = '\0';
            auVar41[3] = '\0';
            auVar41[4] = '\x01';
            auVar41[5] = '\x02';
            auVar41[6] = '\x03';
            auVar41[7] = '\x04';
            auVar41[0x10] = '\0';
            auVar41[0x11] = '\0';
            auVar41[0x12] = '\0';
            auVar41[0x13] = '\0';
            auVar41[0x14] = '\x01';
            auVar41[0x15] = '\x02';
            auVar41[0x16] = '\x03';
            auVar41[0x17] = '\x04';
            auVar41[0x18] = '\x05';
            auVar41[0x19] = '\x06';
            auVar41[0x1a] = '\a';
            auVar41[0x1b] = '\b';
            auVar41[0x1c] = '\t';
            auVar41[0x1d] = '\n';
            auVar41[0x1e] = '\v';
            auVar41[0x1f] = '\f';
            local_13a0 = vpshufb_avx2(auVar63,auVar41);
            local_13c0 = vpalignr_avx2(local_13c0,auVar63,0xd);
          }
          bVar62 = local_1330 + 0x20 == local_1080;
          if (bVar62) {
            local_132c = 5;
          }
          local_398 = (ulong *)(local_1068 +
                               (((local_1324 * local_106c + local_1330) - local_132c) + 0x1d));
          local_f70 = *local_398;
          uStack_3a8 = 0;
          local_3b8 = (ulong *)(local_1068 +
                               ((((local_1324 + 1) * local_106c + local_1330) - local_132c) + 0x1d))
          ;
          local_f80 = *local_3b8;
          uStack_3c8 = 0;
          uStack_f68 = 0;
          auVar11._8_8_ = 0;
          auVar11._0_8_ = local_f70;
          uStack_f78 = 0;
          auVar10._8_8_ = 0;
          auVar10._0_8_ = local_f80;
          local_1420._0_16_ = ZEXT116(0) * auVar10 + ZEXT116(1) * auVar11;
          local_1420._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar10;
          if (bVar62) {
            local_1c0 = vpsrldq_avx2(local_1420,5);
            local_1e0[0] = '\0';
            local_1e0[1] = '\x01';
            local_1e0[2] = '\x02';
            local_1e0[3] = '\x02';
            local_1e0[4] = '\x02';
            local_1e0[5] = '\x02';
            local_1e0[6] = '\x02';
            local_1e0[7] = '\x02';
            local_1e0[8] = '\x02';
            local_1e0[9] = '\x02';
            local_1e0[10] = '\x02';
            local_1e0[0xb] = '\x02';
            local_1e0[0xc] = '\x02';
            local_1e0[0xd] = '\x02';
            local_1e0[0xe] = '\x02';
            local_1e0[0xf] = '\x02';
            local_1e0[0x10] = '\0';
            local_1e0[0x11] = '\x01';
            local_1e0[0x12] = '\x02';
            local_1e0[0x13] = '\x02';
            local_1e0[0x14] = '\x02';
            local_1e0[0x15] = '\x02';
            local_1e0[0x16] = '\x02';
            local_1e0[0x17] = '\x02';
            local_1e0[0x18] = '\x02';
            local_1e0[0x19] = '\x02';
            local_1e0[0x1a] = '\x02';
            local_1e0[0x1b] = '\x02';
            local_1e0[0x1c] = '\x02';
            local_1e0[0x1d] = '\x02';
            local_1e0[0x1e] = '\x02';
            local_1e0[0x1f] = '\x02';
            auVar40[8] = '\x02';
            auVar40[9] = '\x02';
            auVar40[10] = '\x02';
            auVar40[0xb] = '\x02';
            auVar40[0xc] = '\x02';
            auVar40[0xd] = '\x02';
            auVar40[0xe] = '\x02';
            auVar40[0xf] = '\x02';
            auVar40[0] = '\0';
            auVar40[1] = '\x01';
            auVar40[2] = '\x02';
            auVar40[3] = '\x02';
            auVar40[4] = '\x02';
            auVar40[5] = '\x02';
            auVar40[6] = '\x02';
            auVar40[7] = '\x02';
            auVar40[0x10] = '\0';
            auVar40[0x11] = '\x01';
            auVar40[0x12] = '\x02';
            auVar40[0x13] = '\x02';
            auVar40[0x14] = '\x02';
            auVar40[0x15] = '\x02';
            auVar40[0x16] = '\x02';
            auVar40[0x17] = '\x02';
            auVar40[0x18] = '\x02';
            auVar40[0x19] = '\x02';
            auVar40[0x1a] = '\x02';
            auVar40[0x1b] = '\x02';
            auVar40[0x1c] = '\x02';
            auVar40[0x1d] = '\x02';
            auVar40[0x1e] = '\x02';
            auVar40[0x1f] = '\x02';
            local_1420 = vpshufb_avx2(local_1c0,auVar40);
          }
          local_1120 = local_13a0._0_8_;
          uStack_1118 = local_13a0._8_8_;
          uStack_1110 = local_13a0._16_8_;
          uStack_1108 = local_13a0._24_8_;
          local_1100 = vpalignr_avx2(local_13c0,local_13a0,2);
          local_10e0 = vpalignr_avx2(local_13c0,local_13a0,4);
          local_10c0 = vpalignr_avx2(local_13c0,local_13a0,6);
          local_11a0 = local_13c0._0_8_;
          uStack_1198 = local_13c0._8_8_;
          uStack_1190 = local_13c0._16_8_;
          uStack_1188 = local_13c0._24_8_;
          local_1180 = vpalignr_avx2(local_1420,local_13c0,2);
          local_1160 = vpalignr_avx2(local_1420,local_13c0,4);
          local_1140 = vpalignr_avx2(local_1420,local_13c0,6);
          local_1480 = ZEXT832((ulong)coeffs) << 0x40;
          local_14a0 = ZEXT832((ulong)coeffs) << 0x40;
          local_1440 = ZEXT832((ulong)coeffs) << 0x40;
          local_1460 = ZEXT832((ulong)coeffs) << 0x40;
          local_3d0 = local_f80;
          local_3b0 = local_f70;
          resize_convolve(s,coeffs_00,res_out_00);
          resize_convolve(s,coeffs_00,res_out_00);
          local_cc0 = 0;
          palStack_cb8 = (__m256i *)coeffs;
          uStack_cb0 = 0;
          uStack_ca8 = 0;
          local_ce0 = uVar50;
          uStack_cd8 = uVar51;
          uStack_cd0 = uVar52;
          uStack_cc8 = uVar53;
          auVar22._16_8_ = uVar52;
          auVar22._0_16_ = auVar3;
          auVar22._24_8_ = uVar53;
          local_a00 = vpaddd_avx2(local_1460,auVar22);
          local_a10 = uVar49;
          uStack_a08 = 0;
          auVar33._8_8_ = 0;
          auVar33._0_8_ = uVar49;
          auVar63 = vpsrad_avx2(local_a00,auVar33);
          local_d00 = 0;
          palStack_cf8 = (__m256i *)coeffs;
          uStack_cf0 = 0;
          uStack_ce8 = 0;
          local_d20 = uVar50;
          uStack_d18 = uVar51;
          uStack_d10 = uVar52;
          uStack_d08 = uVar53;
          auVar21._16_8_ = uVar52;
          auVar21._0_16_ = auVar3;
          auVar21._24_8_ = uVar53;
          local_a40 = vpaddd_avx2(local_14a0,auVar21);
          local_a50 = uVar49;
          uStack_a48 = 0;
          auVar32._8_8_ = 0;
          auVar32._0_8_ = uVar49;
          auVar4 = vpsrad_avx2(local_a40,auVar32);
          local_1460._0_8_ = auVar63._0_8_;
          local_880 = local_1460._0_8_;
          local_1460._8_8_ = auVar63._8_8_;
          uStack_878 = local_1460._8_8_;
          local_1460._16_8_ = auVar63._16_8_;
          uStack_870 = local_1460._16_8_;
          local_1460._24_8_ = auVar63._24_8_;
          uStack_868 = local_1460._24_8_;
          local_14a0._0_8_ = auVar4._0_8_;
          local_8a0 = local_14a0._0_8_;
          local_14a0._8_8_ = auVar4._8_8_;
          uStack_898 = local_14a0._8_8_;
          local_14a0._16_8_ = auVar4._16_8_;
          uStack_890 = local_14a0._16_8_;
          local_14a0._24_8_ = auVar4._24_8_;
          uStack_888 = local_14a0._24_8_;
          auVar63 = vpackusdw_avx2(auVar63,auVar4);
          local_d40 = 0;
          palStack_d38 = (__m256i *)coeffs;
          uStack_d30 = 0;
          uStack_d28 = 0;
          local_d60 = uVar50;
          uStack_d58 = uVar51;
          uStack_d50 = uVar52;
          uStack_d48 = uVar53;
          auVar20._16_8_ = uVar52;
          auVar20._0_16_ = auVar3;
          auVar20._24_8_ = uVar53;
          local_a80 = vpaddd_avx2(local_1440,auVar20);
          local_a90 = uVar49;
          uStack_a88 = 0;
          auVar31._8_8_ = 0;
          auVar31._0_8_ = uVar49;
          auVar4 = vpsrad_avx2(local_a80,auVar31);
          local_d80 = 0;
          palStack_d78 = (__m256i *)coeffs;
          uStack_d70 = 0;
          uStack_d68 = 0;
          local_da0 = uVar50;
          uStack_d98 = uVar51;
          uStack_d90 = uVar52;
          uStack_d88 = uVar53;
          auVar19._16_8_ = uVar52;
          auVar19._0_16_ = auVar3;
          auVar19._24_8_ = uVar53;
          local_ac0 = vpaddd_avx2(local_1480,auVar19);
          local_ad0 = uVar49;
          uStack_ac8 = 0;
          auVar30._8_8_ = 0;
          auVar30._0_8_ = uVar49;
          auVar5 = vpsrad_avx2(local_ac0,auVar30);
          local_1440._0_8_ = auVar4._0_8_;
          local_8c0 = local_1440._0_8_;
          local_1440._8_8_ = auVar4._8_8_;
          uStack_8b8 = local_1440._8_8_;
          local_1440._16_8_ = auVar4._16_8_;
          uStack_8b0 = local_1440._16_8_;
          local_1440._24_8_ = auVar4._24_8_;
          uStack_8a8 = local_1440._24_8_;
          local_1480._0_8_ = auVar5._0_8_;
          local_8e0 = local_1480._0_8_;
          local_1480._8_8_ = auVar5._8_8_;
          uStack_8d8 = local_1480._8_8_;
          local_1480._16_8_ = auVar5._16_8_;
          uStack_8d0 = local_1480._16_8_;
          local_1480._24_8_ = auVar5._24_8_;
          uStack_8c8 = local_1480._24_8_;
          auVar4 = vpackusdw_avx2(auVar4,auVar5);
          local_14c0 = auVar63._0_8_;
          local_780 = local_14c0;
          uStack_14b8 = auVar63._8_8_;
          uStack_778 = uStack_14b8;
          uStack_14b0 = auVar63._16_8_;
          uStack_770 = uStack_14b0;
          uStack_14a8 = auVar63._24_8_;
          uStack_768 = uStack_14a8;
          local_14e0 = auVar4._0_8_;
          local_7a0 = local_14e0;
          uStack_14d8 = auVar4._8_8_;
          uStack_798 = uStack_14d8;
          uStack_14d0 = auVar4._16_8_;
          uStack_790 = uStack_14d0;
          uStack_14c8 = auVar4._24_8_;
          uStack_788 = uStack_14c8;
          auVar63 = vpackuswb_avx2(auVar63,auVar4);
          local_1500 = auVar63._0_8_;
          local_680 = local_1500;
          uStack_14f8 = auVar63._8_8_;
          uStack_678 = uStack_14f8;
          uStack_14f0 = auVar63._16_8_;
          uStack_670 = uStack_14f0;
          uStack_14e8 = auVar63._24_8_;
          uStack_668 = uStack_14e8;
          local_6a0 = uVar54;
          uStack_698 = uVar55;
          uStack_690 = uVar56;
          uStack_688 = uVar57;
          auVar37._16_8_ = uVar56;
          auVar37._0_16_ = auVar2;
          auVar37._24_8_ = uVar57;
          vpminub_avx2(auVar63,auVar37);
          local_580 = local_1500;
          uStack_578 = uStack_14f8;
          uStack_570 = uStack_14f0;
          uStack_568 = uStack_14e8;
          palStack_598 = (__m256i *)coeffs;
          uStack_590 = 0;
          uStack_588 = 0;
          auVar63 = vpmaxub_avx2(auVar63,ZEXT832((ulong)coeffs) << 0x40);
          local_1520 = auVar63._0_8_;
          local_480 = local_1520;
          uStack_1518 = auVar63._8_8_;
          uStack_478 = uStack_1518;
          auStack_1510._0_8_ = auVar63._16_8_;
          uStack_470 = auStack_1510._0_8_;
          auStack_1510._8_8_ = auVar63._24_8_;
          uStack_468 = auStack_1510._8_8_;
          uStack_128 = auStack_1510._8_8_;
          local_130 = auStack_1510._0_8_;
          auStack_1510 = auVar63._16_16_;
          local_4e8 = (undefined8 *)(local_1078 + (local_1324 * in_R9D + local_1330 / 2));
          auVar43._8_8_ = uStack_1538;
          auVar43._0_8_ = local_1540;
          local_500 = vpunpckldq_avx(auStack_1510,auVar43);
          *local_4e8 = local_500._0_8_;
          local_4e8[1] = local_500._8_8_;
          local_508 = (undefined1 (*) [16])
                      (local_1078 + ((local_1324 + 1) * in_R9D + local_1330 / 2));
          auVar45._8_8_ = uStack_1538;
          auVar45._0_8_ = local_1540;
          local_520 = vpunpckhdq_avx(auStack_1510,auVar45);
          *local_508 = local_520;
          local_5a0 = uVar46;
          local_f0 = local_130;
          uStack_e8 = uStack_128;
        }
      }
    }
    else {
      for (local_1544 = 0; local_1544 < local_107c; local_1544 = local_1544 + 2) {
        local_1548 = 0;
        local_1550 = 0;
        local_1554 = 0;
        for (local_154c = local_1080;
            ((local_1554 <= local_1080 + -0x20 && (local_154c != 0x22)) && (local_154c != 0x24));
            local_154c = local_154c + -0x20) {
          local_350 = (undefined1 (*) [32])
                      (local_1068 + ((local_1544 * local_106c + local_1554) - local_1548));
          local_358 = (undefined1 (*) [32])
                      (local_1068 + (((local_1544 + 1) * local_106c + local_1554) - local_1548));
          auVar63 = vperm2i128_avx2(*local_350,*local_358,0x20);
          local_15e0 = vperm2i128_avx2(*local_350,*local_358,0x31);
          local_1548 = 3;
          local_15c0 = auVar63;
          if (local_1554 == 0) {
            local_15c0._0_8_ = auVar63._0_8_;
            local_15c0._8_8_ = auVar63._8_8_;
            local_15c0._16_8_ = auVar63._16_8_;
            local_15c0._24_8_ = auVar63._24_8_;
            local_200 = local_15c0._0_8_;
            uStack_1f8 = local_15c0._8_8_;
            uStack_1f0 = local_15c0._16_8_;
            uStack_1e8 = local_15c0._24_8_;
            local_220[0] = '\0';
            local_220[1] = '\0';
            local_220[2] = '\0';
            local_220[3] = '\0';
            local_220[4] = '\x01';
            local_220[5] = '\x02';
            local_220[6] = '\x03';
            local_220[7] = '\x04';
            local_220[8] = '\x05';
            local_220[9] = '\x06';
            local_220[10] = '\a';
            local_220[0xb] = '\b';
            local_220[0xc] = '\t';
            local_220[0xd] = '\n';
            local_220[0xe] = '\v';
            local_220[0xf] = '\f';
            local_220[0x10] = '\0';
            local_220[0x11] = '\0';
            local_220[0x12] = '\0';
            local_220[0x13] = '\0';
            local_220[0x14] = '\x01';
            local_220[0x15] = '\x02';
            local_220[0x16] = '\x03';
            local_220[0x17] = '\x04';
            local_220[0x18] = '\x05';
            local_220[0x19] = '\x06';
            local_220[0x1a] = '\a';
            local_220[0x1b] = '\b';
            local_220[0x1c] = '\t';
            local_220[0x1d] = '\n';
            local_220[0x1e] = '\v';
            local_220[0x1f] = '\f';
            auVar39[8] = '\x05';
            auVar39[9] = '\x06';
            auVar39[10] = '\a';
            auVar39[0xb] = '\b';
            auVar39[0xc] = '\t';
            auVar39[0xd] = '\n';
            auVar39[0xe] = '\v';
            auVar39[0xf] = '\f';
            auVar39[0] = '\0';
            auVar39[1] = '\0';
            auVar39[2] = '\0';
            auVar39[3] = '\0';
            auVar39[4] = '\x01';
            auVar39[5] = '\x02';
            auVar39[6] = '\x03';
            auVar39[7] = '\x04';
            auVar39[0x10] = '\0';
            auVar39[0x11] = '\0';
            auVar39[0x12] = '\0';
            auVar39[0x13] = '\0';
            auVar39[0x14] = '\x01';
            auVar39[0x15] = '\x02';
            auVar39[0x16] = '\x03';
            auVar39[0x17] = '\x04';
            auVar39[0x18] = '\x05';
            auVar39[0x19] = '\x06';
            auVar39[0x1a] = '\a';
            auVar39[0x1b] = '\b';
            auVar39[0x1c] = '\t';
            auVar39[0x1d] = '\n';
            auVar39[0x1e] = '\v';
            auVar39[0x1f] = '\f';
            local_15c0 = vpshufb_avx2(auVar63,auVar39);
            local_15e0 = vpalignr_avx2(local_15e0,auVar63,0xd);
          }
          bVar62 = local_1554 + 0x20 == local_1080;
          if (bVar62) {
            local_1550 = 5;
          }
          local_3d8 = (ulong *)(local_1068 +
                               (((local_1544 * local_106c + local_1554) - local_1550) + 0x1d));
          local_f90 = *local_3d8;
          uStack_3e8 = 0;
          local_3f8 = (ulong *)(local_1068 +
                               ((((local_1544 + 1) * local_106c + local_1554) - local_1550) + 0x1d))
          ;
          local_fa0 = *local_3f8;
          uStack_408 = 0;
          uStack_f88 = 0;
          auVar9._8_8_ = 0;
          auVar9._0_8_ = local_f90;
          uStack_f98 = 0;
          auVar8._8_8_ = 0;
          auVar8._0_8_ = local_fa0;
          local_1640._0_16_ = ZEXT116(0) * auVar8 + ZEXT116(1) * auVar9;
          local_1640._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar8;
          if (bVar62) {
            local_240 = vpsrldq_avx2(local_1640,5);
            local_260[0] = '\0';
            local_260[1] = '\x01';
            local_260[2] = '\x02';
            local_260[3] = '\x02';
            local_260[4] = '\x02';
            local_260[5] = '\x02';
            local_260[6] = '\x02';
            local_260[7] = '\x02';
            local_260[8] = '\x02';
            local_260[9] = '\x02';
            local_260[10] = '\x02';
            local_260[0xb] = '\x02';
            local_260[0xc] = '\x02';
            local_260[0xd] = '\x02';
            local_260[0xe] = '\x02';
            local_260[0xf] = '\x02';
            local_260[0x10] = '\0';
            local_260[0x11] = '\x01';
            local_260[0x12] = '\x02';
            local_260[0x13] = '\x02';
            local_260[0x14] = '\x02';
            local_260[0x15] = '\x02';
            local_260[0x16] = '\x02';
            local_260[0x17] = '\x02';
            local_260[0x18] = '\x02';
            local_260[0x19] = '\x02';
            local_260[0x1a] = '\x02';
            local_260[0x1b] = '\x02';
            local_260[0x1c] = '\x02';
            local_260[0x1d] = '\x02';
            local_260[0x1e] = '\x02';
            local_260[0x1f] = '\x02';
            auVar38[8] = '\x02';
            auVar38[9] = '\x02';
            auVar38[10] = '\x02';
            auVar38[0xb] = '\x02';
            auVar38[0xc] = '\x02';
            auVar38[0xd] = '\x02';
            auVar38[0xe] = '\x02';
            auVar38[0xf] = '\x02';
            auVar38[0] = '\0';
            auVar38[1] = '\x01';
            auVar38[2] = '\x02';
            auVar38[3] = '\x02';
            auVar38[4] = '\x02';
            auVar38[5] = '\x02';
            auVar38[6] = '\x02';
            auVar38[7] = '\x02';
            auVar38[0x10] = '\0';
            auVar38[0x11] = '\x01';
            auVar38[0x12] = '\x02';
            auVar38[0x13] = '\x02';
            auVar38[0x14] = '\x02';
            auVar38[0x15] = '\x02';
            auVar38[0x16] = '\x02';
            auVar38[0x17] = '\x02';
            auVar38[0x18] = '\x02';
            auVar38[0x19] = '\x02';
            auVar38[0x1a] = '\x02';
            auVar38[0x1b] = '\x02';
            auVar38[0x1c] = '\x02';
            auVar38[0x1d] = '\x02';
            auVar38[0x1e] = '\x02';
            auVar38[0x1f] = '\x02';
            local_1640 = vpshufb_avx2(local_240,auVar38);
          }
          local_1120 = local_15c0._0_8_;
          uStack_1118 = local_15c0._8_8_;
          uStack_1110 = local_15c0._16_8_;
          uStack_1108 = local_15c0._24_8_;
          local_1100 = vpalignr_avx2(local_15e0,local_15c0,2);
          local_10e0 = vpalignr_avx2(local_15e0,local_15c0,4);
          local_10c0 = vpalignr_avx2(local_15e0,local_15c0,6);
          local_11a0 = local_15e0._0_8_;
          uStack_1198 = local_15e0._8_8_;
          uStack_1190 = local_15e0._16_8_;
          uStack_1188 = local_15e0._24_8_;
          local_1180 = vpalignr_avx2(local_1640,local_15e0,2);
          local_1160 = vpalignr_avx2(local_1640,local_15e0,4);
          local_1140 = vpalignr_avx2(local_1640,local_15e0,6);
          _local_16a0 = ZEXT832((ulong)coeffs) << 0x40;
          auVar6 = _local_16a0;
          local_16c0 = ZEXT832((ulong)coeffs) << 0x40;
          local_410 = local_fa0;
          local_3f0 = local_f90;
          resize_convolve(s,coeffs_00,res_out_00);
          resize_convolve(s,coeffs_00,res_out_00);
          input_00 = (__m256i *)coeffs;
          palStack_db8 = input_00;
          uStack_db0 = 0;
          uStack_da8 = 0;
          local_de0 = uVar50;
          uStack_dd8 = uVar51;
          uStack_dd0 = uVar52;
          uStack_dc8 = uVar53;
          auVar18._16_8_ = uVar52;
          auVar18._0_16_ = auVar3;
          auVar18._24_8_ = uVar53;
          local_b00 = vpaddd_avx2(ZEXT832((ulong)coeffs) << 0x40,auVar18);
          local_b10 = uVar49;
          uStack_b08 = 0;
          auVar29._8_8_ = 0;
          auVar29._0_8_ = uVar49;
          auVar5 = vpsrad_avx2(local_b00,auVar29);
          local_e00 = 0;
          palStack_df8 = (__m256i *)coeffs;
          uStack_df0 = 0;
          uStack_de8 = 0;
          local_e20 = uVar50;
          uStack_e18 = uVar51;
          uStack_e10 = uVar52;
          uStack_e08 = uVar53;
          auVar17._16_8_ = uVar52;
          auVar17._0_16_ = auVar3;
          auVar17._24_8_ = uVar53;
          local_b40 = vpaddd_avx2(local_16c0,auVar17);
          local_b50 = uVar49;
          uStack_b48 = 0;
          auVar28._8_8_ = 0;
          auVar28._0_8_ = uVar49;
          auVar63 = vpsrad_avx2(local_b40,auVar28);
          input_00 = auVar5._8_8_;
          uStack_1670 = auVar5._16_8_;
          uStack_8f0 = uStack_1670;
          uStack_1668 = auVar5._24_8_;
          uStack_8e8 = uStack_1668;
          local_16c0._0_8_ = auVar63._0_8_;
          local_920 = local_16c0._0_8_;
          local_16c0._8_8_ = auVar63._8_8_;
          uStack_918 = local_16c0._8_8_;
          local_16c0._16_8_ = auVar63._16_8_;
          uStack_910 = local_16c0._16_8_;
          local_16c0._24_8_ = auVar63._24_8_;
          uStack_908 = local_16c0._24_8_;
          auVar63 = vpackusdw_avx2(auVar5,auVar63);
          palStack_e38 = (__m256i *)coeffs;
          uStack_e30 = 0;
          uStack_e28 = 0;
          local_e60 = uVar50;
          uStack_e58 = uVar51;
          uStack_e50 = uVar52;
          uStack_e48 = uVar53;
          auVar16._16_8_ = uVar52;
          auVar16._0_16_ = auVar3;
          auVar16._24_8_ = uVar53;
          local_b80 = vpaddd_avx2(ZEXT832((ulong)coeffs) << 0x40,auVar16);
          local_b90 = uVar49;
          uStack_b88 = 0;
          auVar27._8_8_ = 0;
          auVar27._0_8_ = uVar49;
          auVar4 = vpsrad_avx2(local_b80,auVar27);
          local_e80 = 0;
          palVar65 = (__m256i *)coeffs;
          palStack_e78 = palVar65;
          uVar66 = 0;
          uStack_e70 = uVar66;
          intbuf_00 = (uint8_t *)0x0;
          uStack_e68 = intbuf_00;
          local_ea0 = uVar50;
          uStack_e98 = uVar51;
          uStack_e90 = uVar52;
          uStack_e88 = uVar53;
          auVar15._16_8_ = uVar52;
          auVar15._0_16_ = auVar3;
          auVar15._24_8_ = uVar53;
          local_bc0 = vpaddd_avx2(auVar6,auVar15);
          local_bd0 = uVar49;
          uStack_bc8 = 0;
          auVar26._8_8_ = 0;
          auVar26._0_8_ = uVar49;
          auVar6 = vpsrad_avx2(local_bc0,auVar26);
          local_1660 = auVar4._0_8_;
          local_940 = local_1660;
          uStack_1658 = auVar4._8_8_;
          uStack_938 = uStack_1658;
          uStack_1650 = auVar4._16_8_;
          uStack_930 = uStack_1650;
          uStack_1648 = auVar4._24_8_;
          uStack_928 = uStack_1648;
          local_16a0 = auVar6._0_8_;
          local_960 = local_16a0;
          palVar65 = auVar6._8_8_;
          uVar66 = auVar6._16_8_;
          intbuf_00 = auVar6._24_8_;
          auVar4 = vpackusdw_avx2(auVar4,auVar6);
          local_16e0 = auVar63._0_8_;
          local_7c0 = local_16e0;
          uStack_16d8 = auVar63._8_8_;
          uStack_7b8 = uStack_16d8;
          uStack_16d0 = auVar63._16_8_;
          uStack_7b0 = uStack_16d0;
          uStack_16c8 = auVar63._24_8_;
          uStack_7a8 = uStack_16c8;
          local_1700 = auVar4._0_8_;
          local_7e0 = local_1700;
          uStack_16f8 = auVar4._8_8_;
          uStack_7d8 = uStack_16f8;
          uStack_16f0 = auVar4._16_8_;
          uStack_7d0 = uStack_16f0;
          uStack_16e8 = auVar4._24_8_;
          uStack_7c8 = uStack_16e8;
          auVar63 = vpackuswb_avx2(auVar63,auVar4);
          local_1720 = auVar63._0_8_;
          local_6c0 = local_1720;
          uStack_1718 = auVar63._8_8_;
          uStack_6b8 = uStack_1718;
          uStack_1710 = auVar63._16_8_;
          uStack_6b0 = uStack_1710;
          uStack_1708 = auVar63._24_8_;
          uStack_6a8 = uStack_1708;
          local_6e0 = uVar54;
          uStack_6d8 = uVar55;
          uStack_6d0 = uVar56;
          uStack_6c8 = uVar57;
          auVar36._16_8_ = uVar56;
          auVar36._0_16_ = auVar2;
          auVar36._24_8_ = uVar57;
          vpminub_avx2(auVar63,auVar36);
          local_5c0 = local_1720;
          uStack_5b8 = uStack_1718;
          uStack_5b0 = uStack_1710;
          uStack_5a8 = uStack_1708;
          palStack_5d8 = (__m256i *)coeffs;
          uStack_5d0 = 0;
          uStack_5c8 = 0;
          auVar63 = vpmaxub_avx2(auVar63,ZEXT832((ulong)coeffs) << 0x40);
          local_1740 = auVar63._0_8_;
          local_4a0 = local_1740;
          uStack_1738 = auVar63._8_8_;
          uStack_498 = uStack_1738;
          auStack_1730._0_8_ = auVar63._16_8_;
          uStack_490 = auStack_1730._0_8_;
          auStack_1730._8_8_ = auVar63._24_8_;
          uStack_488 = auStack_1730._8_8_;
          uStack_148 = auStack_1730._8_8_;
          local_150 = auStack_1730._0_8_;
          auStack_1730 = auVar63._16_16_;
          local_528 = (undefined8 *)(local_1078 + (local_1544 * in_R9D + local_1554 / 2));
          auVar42._8_8_ = uStack_1758;
          auVar42._0_8_ = local_1760;
          local_540 = vpunpckldq_avx(auStack_1730,auVar42);
          *local_528 = local_540._0_8_;
          local_528[1] = local_540._8_8_;
          local_548 = (undefined1 (*) [16])
                      (local_1078 + ((local_1544 + 1) * in_R9D + local_1554 / 2));
          auVar44._8_8_ = uStack_1758;
          auVar44._0_8_ = local_1760;
          local_560 = vpunpckhdq_avx(auStack_1730,auVar44);
          *local_548 = local_560;
          local_1554 = local_1554 + 0x20;
          local_e40 = uVar46;
          local_dc0 = uVar46;
          uStack_958 = palVar65;
          uStack_950 = uVar66;
          uStack_948 = intbuf_00;
          local_900 = auVar5._0_8_;
          uStack_8f8 = input_00;
          local_5e0 = uVar46;
          local_110 = local_150;
          uStack_108 = uStack_148;
        }
        iVar58 = local_1080 - local_154c;
        if (((0xf < local_154c) && (local_154c != 0x12)) && (local_154c != 0x14)) {
          local_154c = (local_1080 - iVar58) + -0x10;
          iVar59 = local_1544 * local_106c + iVar58;
          iVar60 = local_1544 * in_R9D + iVar58 / 2;
          local_1008 = (undefined1 (*) [16])(local_1068 + (iVar59 - local_1548));
          local_fb0 = *(undefined8 *)*local_1008;
          uStack_fa8 = *(undefined8 *)(*local_1008 + 8);
          local_1010 = (undefined1 (*) [16])(local_1068 + ((iVar59 + local_106c) - local_1548));
          local_fc0 = *(undefined8 *)*local_1010;
          uStack_fb8 = *(undefined8 *)(*local_1010 + 8);
          auVar63._0_16_ = ZEXT116(0) * *local_1010 + ZEXT116(1) * *local_1008;
          auVar63._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * *local_1010
          ;
          local_17c0 = auVar63;
          if (local_1548 == 0) {
            local_17c0._16_8_ = auVar63._16_8_;
            local_17c0._24_8_ = auVar63._24_8_;
            local_2a0[0] = '\0';
            local_2a0[1] = '\0';
            local_2a0[2] = '\0';
            local_2a0[3] = '\0';
            local_2a0[4] = '\x01';
            local_2a0[5] = '\x02';
            local_2a0[6] = '\x03';
            local_2a0[7] = '\x04';
            local_2a0[8] = '\x05';
            local_2a0[9] = '\x06';
            local_2a0[10] = '\a';
            local_2a0[0xb] = '\b';
            local_2a0[0xc] = '\t';
            local_2a0[0xd] = '\n';
            local_2a0[0xe] = '\v';
            local_2a0[0xf] = '\f';
            local_2a0[0x10] = '\0';
            local_2a0[0x11] = '\0';
            local_2a0[0x12] = '\0';
            local_2a0[0x13] = '\0';
            local_2a0[0x14] = '\x01';
            local_2a0[0x15] = '\x02';
            local_2a0[0x16] = '\x03';
            local_2a0[0x17] = '\x04';
            local_2a0[0x18] = '\x05';
            local_2a0[0x19] = '\x06';
            local_2a0[0x1a] = '\a';
            local_2a0[0x1b] = '\b';
            local_2a0[0x1c] = '\t';
            local_2a0[0x1d] = '\n';
            local_2a0[0x1e] = '\v';
            local_2a0[0x1f] = '\f';
            auVar5._16_8_ = local_17c0._16_8_;
            auVar5._0_16_ = auVar63._0_16_;
            auVar5._24_8_ = local_17c0._24_8_;
            auVar4[8] = '\x05';
            auVar4[9] = '\x06';
            auVar4[10] = '\a';
            auVar4[0xb] = '\b';
            auVar4[0xc] = '\t';
            auVar4[0xd] = '\n';
            auVar4[0xe] = '\v';
            auVar4[0xf] = '\f';
            auVar4[0] = '\0';
            auVar4[1] = '\0';
            auVar4[2] = '\0';
            auVar4[3] = '\0';
            auVar4[4] = '\x01';
            auVar4[5] = '\x02';
            auVar4[6] = '\x03';
            auVar4[7] = '\x04';
            auVar4[0x10] = '\0';
            auVar4[0x11] = '\0';
            auVar4[0x12] = '\0';
            auVar4[0x13] = '\0';
            auVar4[0x14] = '\x01';
            auVar4[0x15] = '\x02';
            auVar4[0x16] = '\x03';
            auVar4[0x17] = '\x04';
            auVar4[0x18] = '\x05';
            auVar4[0x19] = '\x06';
            auVar4[0x1a] = '\a';
            auVar4[0x1b] = '\b';
            auVar4[0x1c] = '\t';
            auVar4[0x1d] = '\n';
            auVar4[0x1e] = '\v';
            auVar4[0x1f] = '\f';
            local_17c0 = vpshufb_avx2(auVar5,auVar4);
            local_280 = auVar63._0_16_;
            auStack_270 = auVar63._16_16_;
          }
          local_1548 = 3;
          bVar62 = iVar58 + 0x10 == local_1080;
          if (bVar62) {
            local_1550 = 5;
          }
          local_418 = (ulong *)(local_1068 + ((iVar59 - local_1550) + 0xd));
          local_fd0 = *local_418;
          uStack_428 = 0;
          local_438 = (ulong *)(local_1068 + (((iVar59 + local_106c) - local_1550) + 0xd));
          local_fe0 = *local_438;
          uStack_448 = 0;
          uStack_fc8 = 0;
          auVar7._8_8_ = 0;
          auVar7._0_8_ = local_fd0;
          uStack_fd8 = 0;
          auVar1._8_8_ = 0;
          auVar1._0_8_ = local_fe0;
          local_1800._0_16_ = ZEXT116(0) * auVar1 + ZEXT116(1) * auVar7;
          local_1800._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar1;
          if (bVar62) {
            local_2c0 = vpsrldq_avx2(local_1800,5);
            local_2e0[0] = '\0';
            local_2e0[1] = '\x01';
            local_2e0[2] = '\x02';
            local_2e0[3] = '\x02';
            local_2e0[4] = '\x02';
            local_2e0[5] = '\x02';
            local_2e0[6] = '\x02';
            local_2e0[7] = '\x02';
            local_2e0[8] = '\x02';
            local_2e0[9] = '\x02';
            local_2e0[10] = '\x02';
            local_2e0[0xb] = '\x02';
            local_2e0[0xc] = '\x02';
            local_2e0[0xd] = '\x02';
            local_2e0[0xe] = '\x02';
            local_2e0[0xf] = '\x02';
            local_2e0[0x10] = '\0';
            local_2e0[0x11] = '\x01';
            local_2e0[0x12] = '\x02';
            local_2e0[0x13] = '\x02';
            local_2e0[0x14] = '\x02';
            local_2e0[0x15] = '\x02';
            local_2e0[0x16] = '\x02';
            local_2e0[0x17] = '\x02';
            local_2e0[0x18] = '\x02';
            local_2e0[0x19] = '\x02';
            local_2e0[0x1a] = '\x02';
            local_2e0[0x1b] = '\x02';
            local_2e0[0x1c] = '\x02';
            local_2e0[0x1d] = '\x02';
            local_2e0[0x1e] = '\x02';
            local_2e0[0x1f] = '\x02';
            auVar6[8] = '\x02';
            auVar6[9] = '\x02';
            auVar6[10] = '\x02';
            auVar6[0xb] = '\x02';
            auVar6[0xc] = '\x02';
            auVar6[0xd] = '\x02';
            auVar6[0xe] = '\x02';
            auVar6[0xf] = '\x02';
            auVar6[0] = '\0';
            auVar6[1] = '\x01';
            auVar6[2] = '\x02';
            auVar6[3] = '\x02';
            auVar6[4] = '\x02';
            auVar6[5] = '\x02';
            auVar6[6] = '\x02';
            auVar6[7] = '\x02';
            auVar6[0x10] = '\0';
            auVar6[0x11] = '\x01';
            auVar6[0x12] = '\x02';
            auVar6[0x13] = '\x02';
            auVar6[0x14] = '\x02';
            auVar6[0x15] = '\x02';
            auVar6[0x16] = '\x02';
            auVar6[0x17] = '\x02';
            auVar6[0x18] = '\x02';
            auVar6[0x19] = '\x02';
            auVar6[0x1a] = '\x02';
            auVar6[0x1b] = '\x02';
            auVar6[0x1c] = '\x02';
            auVar6[0x1d] = '\x02';
            auVar6[0x1e] = '\x02';
            auVar6[0x1f] = '\x02';
            local_1800 = vpshufb_avx2(local_2c0,auVar6);
          }
          local_1120 = local_17c0._0_8_;
          uStack_1118 = local_17c0._8_8_;
          uStack_1110 = local_17c0._16_8_;
          uStack_1108 = local_17c0._24_8_;
          local_1100 = vpalignr_avx2(local_1800,local_17c0,2);
          local_10e0 = vpalignr_avx2(local_1800,local_17c0,4);
          local_10c0 = vpalignr_avx2(local_1800,local_17c0,6);
          s = (__m256i *)0x0;
          uVar48 = s;
          coeffs_00 = (__m256i *)coeffs;
          palVar65 = coeffs_00;
          res_out_00 = (__m256i *)0x0;
          uVar66 = res_out_00;
          local_450 = local_fe0;
          local_430 = local_fd0;
          resize_convolve((__m256i *)0x0,(__m256i *)coeffs,(__m256i *)0x0);
          uStack_ea8 = 0;
          local_ee0 = uVar50;
          uStack_ed8 = uVar51;
          uStack_ed0 = uVar52;
          uStack_ec8 = uVar53;
          auVar14._16_8_ = uVar52;
          auVar14._0_16_ = auVar3;
          auVar14._24_8_ = uVar53;
          local_c00 = vpaddd_avx2(ZEXT832((ulong)coeffs) << 0x40,auVar14);
          local_c10 = uVar49;
          uStack_c08 = 0;
          auVar25._8_8_ = 0;
          auVar25._0_8_ = uVar49;
          local_1840 = vpsrad_avx2(local_c00,auVar25);
          local_f00 = 0;
          palStack_ef8 = (__m256i *)coeffs;
          uStack_ef0 = 0;
          uStack_ee8 = 0;
          local_f20 = uVar50;
          uStack_f18 = uVar51;
          uStack_f10 = uVar52;
          uStack_f08 = uVar53;
          auVar13._16_8_ = uVar52;
          auVar13._0_16_ = auVar3;
          auVar13._24_8_ = uVar53;
          local_c40 = vpaddd_avx2(ZEXT832((ulong)coeffs) << 0x40,auVar13);
          local_c50 = uVar49;
          uStack_c48 = 0;
          auVar24._8_8_ = 0;
          auVar24._0_8_ = uVar49;
          auVar63 = vpsrad_avx2(local_c40,auVar24);
          local_1820 = auVar63._0_8_;
          uStack_1818 = auVar63._8_8_;
          uStack_1810 = auVar63._16_8_;
          uStack_1808 = auVar63._24_8_;
          uStack_968 = uStack_1828;
          local_9a0 = local_1820;
          uStack_998 = uStack_1818;
          uStack_990 = uStack_1810;
          uStack_988 = uStack_1808;
          auVar63 = vpackusdw_avx2(local_1840,auVar63);
          local_1860 = auVar63._0_8_;
          uStack_1858 = auVar63._8_8_;
          uStack_1850 = auVar63._16_8_;
          uStack_1848 = auVar63._24_8_;
          local_800 = local_1860;
          uStack_7f8 = uStack_1858;
          uStack_7f0 = uStack_1850;
          uStack_7e8 = uStack_1848;
          local_820 = local_1860;
          uStack_818 = uStack_1858;
          uStack_810 = uStack_1850;
          uStack_808 = uStack_1848;
          auVar63 = vpackuswb_avx2(auVar63,auVar63);
          local_1860 = auVar63._0_8_;
          uStack_1858 = auVar63._8_8_;
          uStack_1850 = auVar63._16_8_;
          uStack_1848 = auVar63._24_8_;
          local_700 = local_1860;
          uStack_6f8 = uStack_1858;
          uStack_6f0 = uStack_1850;
          uStack_6e8 = uStack_1848;
          local_720 = uVar54;
          uStack_718 = uVar55;
          uStack_710 = uVar56;
          uStack_708 = uVar57;
          auVar35._16_8_ = uVar56;
          auVar35._0_16_ = auVar2;
          auVar35._24_8_ = uVar57;
          auVar63 = vpminub_avx2(auVar63,auVar35);
          local_1860 = auVar63._0_8_;
          uStack_1858 = auVar63._8_8_;
          uStack_1850 = auVar63._16_8_;
          uStack_1848 = auVar63._24_8_;
          local_600 = local_1860;
          uStack_5f8 = uStack_1858;
          uStack_5f0 = uStack_1850;
          uStack_5e8 = uStack_1848;
          local_620 = 0;
          palStack_618 = (__m256i *)coeffs;
          uStack_610 = 0;
          uStack_608 = 0;
          auVar63 = vpmaxub_avx2(auVar63,ZEXT832((ulong)coeffs) << 0x40);
          local_4c0 = vpermq_avx2(auVar63,0xd8);
          local_1870 = local_4c0._0_16_;
          auVar1 = vpshufd_avx(local_1870,0xd8);
          local_360 = (undefined8 *)(local_1078 + iVar60);
          local_1870._0_8_ = auVar1._0_8_;
          local_1870._8_8_ = auVar1._8_8_;
          local_370 = local_1870._0_8_;
          uStack_368 = local_1870._8_8_;
          *local_360 = local_1870._0_8_;
          local_378 = (undefined8 *)(local_1078 + (iVar60 + in_R9D));
          local_d0 = local_1870._0_8_;
          uStack_c8 = local_1870._8_8_;
          local_e0 = local_1870._0_8_;
          uStack_d8 = local_1870._8_8_;
          local_390 = vpunpckhqdq_avx(auVar1,auVar1);
          *local_378 = local_390._0_8_;
          local_ec0 = uVar66;
          palStack_eb8 = palVar65;
          uStack_eb0 = uVar48;
          local_980 = res_out_00;
          uStack_978 = coeffs_00;
          uStack_970 = s;
        }
        iVar58 = local_1080 - local_154c;
        if (((7 < local_154c) && (local_154c != 10)) && (local_154c != 0xc)) {
          local_154c = (local_1080 - iVar58) + -8;
          local_1548 = (local_1544 * local_106c + iVar58) - local_1548;
          iVar59 = local_1544 * in_R9D + iVar58 / 2;
          bVar62 = iVar58 + 8 == local_1080;
          if (bVar62) {
            local_1550 = 5;
          }
          local_1018 = (undefined1 (*) [16])(local_1068 + (local_1548 - local_1550));
          local_ff0 = *(undefined8 *)*local_1018;
          uStack_fe8 = *(undefined8 *)(*local_1018 + 8);
          local_1020 = (undefined1 (*) [16])(local_1068 + ((local_1548 + local_106c) - local_1550));
          local_1000 = *(undefined8 *)*local_1020;
          uStack_ff8 = *(undefined8 *)(*local_1020 + 8);
          local_18c0._0_16_ = ZEXT116(0) * *local_1020 + ZEXT116(1) * *local_1018;
          local_18c0._16_16_ =
               ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * *local_1020;
          if (bVar62) {
            local_300 = vpsrldq_avx2(local_18c0,5);
            local_1320 = auVar47._0_8_;
            uStack_1318 = auVar47._8_8_;
            uStack_1310 = auVar47._16_8_;
            uStack_1308 = auVar47._24_8_;
            local_320 = local_1320;
            uStack_318 = uStack_1318;
            uStack_310 = uStack_1310;
            uStack_308 = uStack_1308;
            local_18c0 = vpshufb_avx2(local_300,(undefined1  [32])auVar47);
          }
          local_1120 = local_18c0._0_8_;
          uStack_1118 = local_18c0._8_8_;
          uStack_1110 = local_18c0._16_8_;
          uStack_1108 = local_18c0._24_8_;
          local_1100 = vpsrldq_avx2(local_18c0,2);
          local_10e0 = vpsrldq_avx2(local_18c0,4);
          local_10c0 = vpsrldq_avx2(local_18c0,6);
          in_stack_ffffffffffffe704 = 0;
          plVar61 = local_1220;
          in_stack_ffffffffffffe708 = (__m256i *)coeffs;
          resize_convolve(s,coeffs_00,res_out_00);
          auVar63 = vperm2i128_avx2(ZEXT1232(CONCAT84(in_stack_ffffffffffffe708,
                                                      in_stack_ffffffffffffe704)) << 0x20,
                                    ZEXT832((ulong)coeffs) << 0x40,0x20);
          local_1920 = auVar63._0_8_;
          uStackY_1918 = auVar63._8_8_;
          uVar64 = auVar63._16_8_;
          uStack_f30 = uVar64;
          output = auVar63._24_8_;
          uStack_f28 = output;
          local_f40 = local_1920;
          uStack_f38 = uStackY_1918;
          local_f60 = uVar50;
          uStack_f58 = uVar51;
          uStack_f50 = uVar52;
          uStack_f48 = uVar53;
          auVar12._16_8_ = uVar52;
          auVar12._0_16_ = auVar3;
          auVar12._24_8_ = uVar53;
          local_c80 = vpaddd_avx2(auVar63,auVar12);
          local_c90 = uVar49;
          uStack_c88 = 0;
          auVar23._8_8_ = 0;
          auVar23._0_8_ = uVar49;
          _local_1920 = vpsrad_avx2(local_c80,auVar23);
          local_9c0 = local_1920;
          uStack_9b8 = uStackY_1918;
          local_9e0 = local_1920;
          uStack_9d8 = uStackY_1918;
          auVar63 = vpackusdw_avx2(_local_1920,_local_1920);
          local_1940 = auVar63._0_8_;
          uStackY_1938 = auVar63._8_8_;
          uStackY_1930 = auVar63._16_8_;
          uStackY_1928 = auVar63._24_8_;
          local_840 = local_1940;
          uStack_838 = uStackY_1938;
          uStack_830 = uStackY_1930;
          uStack_828 = uStackY_1928;
          local_860 = local_1940;
          uStack_858 = uStackY_1938;
          uStack_850 = uStackY_1930;
          uStack_848 = uStackY_1928;
          auVar63 = vpackuswb_avx2(auVar63,auVar63);
          local_1940 = auVar63._0_8_;
          uStackY_1938 = auVar63._8_8_;
          uStackY_1930 = auVar63._16_8_;
          uStackY_1928 = auVar63._24_8_;
          local_740 = local_1940;
          uStack_738 = uStackY_1938;
          uStack_730 = uStackY_1930;
          uStack_728 = uStackY_1928;
          local_760 = uVar54;
          uStack_758 = uVar55;
          uStack_750 = uVar56;
          uStack_748 = uVar57;
          auVar34._16_8_ = uVar56;
          auVar34._0_16_ = auVar2;
          auVar34._24_8_ = uVar57;
          auVar63 = vpminub_avx2(auVar63,auVar34);
          local_1940 = auVar63._0_8_;
          uStackY_1938 = auVar63._8_8_;
          uStackY_1930 = auVar63._16_8_;
          uStackY_1928 = auVar63._24_8_;
          local_640 = local_1940;
          uStack_638 = uStackY_1938;
          uStack_630 = uStackY_1930;
          uStack_628 = uStackY_1928;
          local_660 = 0;
          palStack_658 = (__m256i *)coeffs;
          uStack_650 = 0;
          uStack_648 = 0;
          auVar63 = vpmaxub_avx2(auVar63,ZEXT832((ulong)coeffs) << 0x40);
          local_1940 = auVar63._0_8_;
          uStackY_1938 = auVar63._8_8_;
          uStackY_1930 = auVar63._16_8_;
          uStackY_1928 = auVar63._24_8_;
          local_4e0 = local_1940;
          uStack_4d8 = uStackY_1938;
          uStack_4d0 = uStackY_1930;
          uStack_4c8 = uStackY_1928;
          v[1] = extraout_RDX;
          v[0] = (longlong)plVar61;
          uStack_9d0 = uVar64;
          uStack_9c8 = output;
          uStack_9b0 = uVar64;
          uStack_9a8 = output;
          xx_storel_32((void *)(local_1078 + iVar59),v);
          v_00[1] = extraout_RDX_00;
          v_00[0] = (longlong)plVar61;
          xx_storel_32((void *)(local_1078 + iVar59 + (long)in_R9D),v_00);
        }
        if (local_154c != 0) {
          down2_symeven((uint8_t *)in_stack_ffffffffffffe708,in_stack_ffffffffffffe704,output,
                        local_1920._20_4_);
          down2_symeven((uint8_t *)in_stack_ffffffffffffe708,in_stack_ffffffffffffe704,output,
                        local_1920._20_4_);
        }
      }
    }
  }
  return;
}

Assistant:

void av1_resize_horz_dir_avx2(const uint8_t *const input, int in_stride,
                              uint8_t *intbuf, int height, int filtered_length,
                              int width2) {
  assert(height % 2 == 0);
  // Invoke SSE2 for width less than 32.
  if (filtered_length < 32) {
    av1_resize_horz_dir_sse2(input, in_stride, intbuf, height, filtered_length,
                             width2);
    return;
  }

  const int filt_length = sizeof(av1_down2_symeven_half_filter);
  assert(filt_length % 2 == 0);
  (void)filt_length;

  __m256i s0[4], s1[4], coeffs_x[4];

  const int bits = FILTER_BITS;
  const int dst_stride = width2;
  const __m128i round_shift_bits = _mm_cvtsi32_si128(bits);
  const __m256i round_const_bits = _mm256_set1_epi32((1 << bits) >> 1);

  const uint8_t max_pixel = 255;
  const __m256i clip_pixel = _mm256_set1_epi8((char)max_pixel);
  const __m256i zero = _mm256_setzero_si256();

  const __m256i wd32_start_pad_mask =
      _mm256_loadu_si256((__m256i *)wd32_left_padding_mask);
  const __m256i wd32_end_pad_mask =
      _mm256_loadu_si256((__m256i *)wd32_right_padding_mask);
  const __m256i wd8_end_pad_mask =
      _mm256_loadu_si256((__m256i *)wd8_right_padding_mask);
  prepare_filter_coeffs(av1_down2_symeven_half_filter, coeffs_x);

  // The core horizontal SIMD processes 32 input pixels of 2 rows simultaneously
  // to generate output corresponding to 2 rows. To streamline the core loop and
  // eliminate the need for conditional checks, the remaining columns (16 or 8)
  // are processed separately.
  if (filtered_length % 32 == 0) {
    for (int i = 0; i < height; i += 2) {
      int filter_offset = 0;
      int row_offset = 0;
      for (int j = 0; j < filtered_length; j += 32) {
        PROCESS_RESIZE_X_WD32
      }
    }
  } else {
    for (int i = 0; i < height; i += 2) {
      int filter_offset = 0;
      int remain_col = filtered_length;
      int row_offset = 0;
      // To avoid pixel over-read at frame boundary, processing of 32 pixels
      // is done using the core loop only if sufficient number of pixels
      // required for the load are present. The remaining pixels are processed
      // separately.
      for (int j = 0; j <= filtered_length - 32; j += 32) {
        if (remain_col == 34 || remain_col == 36) {
          break;
        }
        PROCESS_RESIZE_X_WD32
        remain_col -= 32;
      }

      int wd_processed = filtered_length - remain_col;
      // To avoid pixel over-read at frame boundary, processing of 16 pixels
      // is done only if sufficient number of pixels required for the
      // load are present. The remaining pixels are processed separately.
      if (remain_col > 15 && remain_col != 18 && remain_col != 20) {
        remain_col = filtered_length - wd_processed - 16;
        const int in_idx = i * in_stride + wd_processed;
        const int out_idx = (i * dst_stride) + wd_processed / 2;
        // a0 a1 --- a15
        __m128i row0 =
            _mm_loadu_si128((__m128i *)&input[in_idx - filter_offset]);
        // b0 b1 --- b15
        __m128i row1 = _mm_loadu_si128(
            (__m128i *)&input[in_idx + in_stride - filter_offset]);
        // a0 a1 --- a15 || b0 b1 --- b15
        __m256i r0 =
            _mm256_permute2x128_si256(CAST_HI(row0), CAST_HI(row1), 0x20);
        if (filter_offset == 0) {
          r0 = _mm256_shuffle_epi8(r0, wd32_start_pad_mask);
        }
        filter_offset = 3;
        const int is_last_cols16 = wd_processed + 16 == filtered_length;
        if (is_last_cols16) row_offset = ROW_OFFSET;

        // a16 a17 --- a23
        row0 = _mm_loadl_epi64(
            (__m128i *)&input[in_idx + 16 - row_offset - filter_offset]);
        // b16 b17 --- b23
        row1 = _mm_loadl_epi64((__m128i *)&input[in_idx + 16 + in_stride -
                                                 row_offset - filter_offset]);

        // a16-a23 x x x x| b16-b23 x x x x
        __m256i r1 =
            _mm256_permute2x128_si256(CAST_HI(row0), CAST_HI(row1), 0x20);

        // Pad end pixels to the right, while processing the last pixels in the
        // row.
        if (is_last_cols16) {
          r1 = _mm256_shuffle_epi8(_mm256_srli_si256(r1, ROW_OFFSET),
                                   wd32_end_pad_mask);
        }

        // a0 a1 --- a15 || b0 b1 --- b15
        s0[0] = r0;
        // a2 a3 --- a17 || b2 b3 --- b17
        s0[1] = _mm256_alignr_epi8(r1, r0, 2);
        // a4 a5 --- a19 || b4 b5 --- b19
        s0[2] = _mm256_alignr_epi8(r1, r0, 4);
        // a6 a7 --- a21 || b6 b7 --- b21
        s0[3] = _mm256_alignr_epi8(r1, r0, 6);

        // result for 16 pixels (a0 to a15) of row0 and row1
        __m256i res_out_0[2];
        res_out_0[0] = res_out_0[1] = zero;
        resize_convolve(s0, coeffs_x, res_out_0);

        // r00-r07
        res_out_0[0] = _mm256_sra_epi32(
            _mm256_add_epi32(res_out_0[0], round_const_bits), round_shift_bits);
        // r10-r17
        res_out_0[1] = _mm256_sra_epi32(
            _mm256_add_epi32(res_out_0[1], round_const_bits), round_shift_bits);
        // r00-r03 r10-r13 r04-r07 r14-r17
        __m256i res_out_row01 = _mm256_packus_epi32(res_out_0[0], res_out_0[1]);
        // r00-r03 r10-r13 r00-r03 r10-r13 | r04-r07 r14-r17 r04-r07 r14-r17
        res_out_row01 = _mm256_packus_epi16(res_out_row01, res_out_row01);
        res_out_row01 = _mm256_min_epu8(res_out_row01, clip_pixel);
        res_out_row01 = _mm256_max_epu8(res_out_row01, zero);
        // r00-r03 r10-r13 r04-r07 r14-r17
        __m128i low_result =
            CAST_LOW(_mm256_permute4x64_epi64(res_out_row01, 0xd8));
        // r00-r03 r04-r07 r10-r13 r14-r17
        low_result = _mm_shuffle_epi32(low_result, 0xd8);

        _mm_storel_epi64((__m128i *)&intbuf[out_idx], low_result);
        _mm_storel_epi64((__m128i *)&intbuf[out_idx + dst_stride],
                         _mm_unpackhi_epi64(low_result, low_result));
      }

      // To avoid pixel over-read at frame boundary, processing of 8 pixels
      // is done only if sufficient number of pixels required for the
      // load are present. The remaining pixels are processed by C function.
      wd_processed = filtered_length - remain_col;
      if (remain_col > 7 && remain_col != 10 && remain_col != 12) {
        remain_col = filtered_length - wd_processed - 8;
        const int in_idx = i * in_stride + wd_processed - filter_offset;
        const int out_idx = (i * dst_stride) + wd_processed / 2;
        const int is_last_cols_8 = wd_processed + 8 == filtered_length;
        if (is_last_cols_8) row_offset = ROW_OFFSET;
        // a0 a1 --- a15
        __m128i row0 = _mm_loadu_si128((__m128i *)&input[in_idx - row_offset]);
        // b0 b1 --- b15
        __m128i row1 =
            _mm_loadu_si128((__m128i *)&input[in_idx + in_stride - row_offset]);
        // a0 a1 --- a15 || b0 b1 --- b15
        __m256i r0 =
            _mm256_permute2x128_si256(CAST_HI(row0), CAST_HI(row1), 0x20);

        // Pad end pixels to the right, while processing the last pixels in the
        // row.
        if (is_last_cols_8)
          r0 = _mm256_shuffle_epi8(_mm256_srli_si256(r0, ROW_OFFSET),
                                   wd8_end_pad_mask);

        // a0 a1 a2 a3 a4 a5 a6 a7 | b0 b1 b2 b3 b4 b5 b6 b7
        s0[0] = r0;
        // a2 a3 a4 a5 a6 a7 a8 a9 | b2 b3 b4 b5 b6 b7 b8 b9
        s0[1] = _mm256_bsrli_epi128(r0, 2);
        // a4 a5 a6 a7 a8 a9 a10 a10 |  b4 b5 b6 b7 b8 b9 b10 b10
        s0[2] = _mm256_bsrli_epi128(r0, 4);
        // a6 a7 a8 a9 a10 a10 a10 a10 | b6 b7 b8 b9 b10 b10 b10 b10
        s0[3] = _mm256_bsrli_epi128(r0, 6);

        __m256i res_out_0[2];
        res_out_0[0] = res_out_0[1] = zero;
        resize_convolve(s0, coeffs_x, res_out_0);

        // r00 - r03 | r10 - r13
        __m256i res_out =
            _mm256_permute2x128_si256(res_out_0[0], res_out_0[1], 0x20);
        // r00 - r03 | r10 - r13
        res_out = _mm256_sra_epi32(_mm256_add_epi32(res_out, round_const_bits),
                                   round_shift_bits);
        // r00-r03 r00-r03 r10-r13 r10-r13
        __m256i res_out_row01 = _mm256_packus_epi32(res_out, res_out);
        // r00-r03 r00-r03 r00-r03 r00-r03 r10-r13 r10-r13 r10-r13 r10-r13
        res_out_row01 = _mm256_packus_epi16(res_out_row01, res_out_row01);
        res_out_row01 = _mm256_min_epu8(res_out_row01, clip_pixel);
        res_out_row01 = _mm256_max_epu8(res_out_row01, zero);

        xx_storel_32(intbuf + out_idx, CAST_LOW(res_out_row01));
        xx_storel_32(intbuf + out_idx + dst_stride,
                     _mm256_extracti128_si256(res_out_row01, 1));
      }

      wd_processed = filtered_length - remain_col;
      if (remain_col) {
        const int in_idx = (in_stride * i);
        const int out_idx = (wd_processed / 2) + width2 * i;

        down2_symeven(input + in_idx, filtered_length, intbuf + out_idx,
                      wd_processed);
        down2_symeven(input + in_idx + in_stride, filtered_length,
                      intbuf + out_idx + width2, wd_processed);
      }
    }
  }
}